

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerUtil.cpp
# Opt level: O2

shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>
jaegertracing::testutils::TracerUtil::installGlobalTracer(void)

{
  __uniq_ptr_data<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>,_true,_true>
  _Var1;
  ostream *poVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,(__gnu_cxx::_Lock_policy)2>
  *in_RDI;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> sVar3;
  allocator local_62c;
  allocator local_62b;
  allocator local_62a;
  allocator local_629;
  unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
  handle;
  duration local_620;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_618;
  __shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2> local_600;
  undefined1 local_5f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  string local_5e0 [32];
  string local_5c0;
  string local_5a0;
  duration local_580;
  string local_578;
  string local_558;
  string local_538;
  Config local_518;
  Config local_4c0;
  undefined1 local_468 [40];
  duration local_440;
  IPAddress local_438;
  shared_ptr<opentracing::v3::Tracer> tracer;
  ostringstream samplingServerURLStream;
  Config config;
  
  _Var1.
  super___uniq_ptr_impl<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
  .super__Head_base<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_false>._M_head_impl
       = (__uniq_ptr_impl<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
          )operator_new(0x10);
  MockAgent::make();
  handle._M_t.
  super___uniq_ptr_impl<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
  .super__Head_base<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_false>._M_head_impl
       = (__uniq_ptr_data<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>,_true,_true>
          )(__uniq_ptr_data<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>,_true,_true>
            )_Var1.
             super___uniq_ptr_impl<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
             .super__Head_base<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_false>.
             _M_head_impl;
  MockAgent::start(*(MockAgent **)
                    _Var1.
                    super___uniq_ptr_impl<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
                    .
                    super__Head_base<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_false>
                    ._M_head_impl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&samplingServerURLStream);
  poVar2 = std::operator<<((ostream *)&samplingServerURLStream,"http://");
  memcpy(&config,(void *)(*(long *)handle._M_t.
                                   super___uniq_ptr_impl<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
                                   .
                                   super__Head_base<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_false>
                                   ._M_head_impl + 0x240),0x88);
  net::IPAddress::authority_abi_cxx11_((string *)&local_438,(IPAddress *)&config);
  std::operator<<(poVar2,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::string((string *)&local_558,"const",&local_629);
  std::__cxx11::stringbuf::str();
  local_580.__r = 0;
  samplers::Config::Config(&local_4c0,&local_558,1.0,&local_578,0,&local_580);
  local_620.__r = 0;
  memcpy(&local_438,
         (void *)(*(long *)handle._M_t.
                           super___uniq_ptr_impl<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
                           .
                           super__Head_base<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_false>
                           ._M_head_impl + 0x30),0x88);
  net::IPAddress::authority_abi_cxx11_(&local_5a0,&local_438);
  std::__cxx11::string::string((string *)&local_5c0,"",&local_62a);
  reporters::Config::Config(&local_518,0,&local_620,false,&local_5a0,&local_5c0);
  propagation::HeadersConfig::HeadersConfig((HeadersConfig *)&tracer);
  std::__cxx11::string::string(local_5e0,"",&local_62b);
  local_468[0] = (allocator)0x0;
  std::__cxx11::string::string((string *)(local_468 + 8),local_5e0);
  local_440.__r = 0;
  std::__cxx11::string::string((string *)&local_538,"",&local_62c);
  local_618.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Config::Config(&config,false,&local_4c0,&local_518,(HeadersConfig *)&tracer,
                 (RestrictionsConfig *)local_468,&local_538,&local_618);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_618);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)(local_468 + 8));
  std::__cxx11::string::~string(local_5e0);
  propagation::HeadersConfig::~HeadersConfig((HeadersConfig *)&tracer);
  reporters::Config::~Config(&local_518);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  samplers::Config::~Config(&local_4c0);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::string((string *)&local_438,"test-service",(allocator *)local_468);
  jaegertracing::logging::nullLogger();
  std::__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<jaegertracing::logging::Logger,std::default_delete<jaegertracing::logging::Logger>,void>
            ((__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_4c0,
             (unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
              *)&local_518);
  Tracer::make((Tracer *)&tracer,(string *)&local_438,&config,
               (shared_ptr<jaegertracing::logging::Logger> *)&local_4c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4c0._type._M_string_length);
  if ((long *)local_518._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_518._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&local_438);
  std::__shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_600,
             &tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>);
  opentracing::v3::Tracer::InitGlobal(local_5f0,&local_600);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_600._M_refcount);
  std::__shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>,void>
            (in_RDI,&handle);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Config::~Config(&config);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&samplingServerURLStream);
  std::
  unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
  ::~unique_ptr(&handle);
  sVar3.
  super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.
  super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>)
         sVar3.
         super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<ResourceHandle> installGlobalTracer()
{
    std::unique_ptr<ResourceHandle> handle(new ResourceHandle());
    handle->_mockAgent->start();
    std::ostringstream samplingServerURLStream;
    samplingServerURLStream
        << "http://" << handle->_mockAgent->samplingServerAddress().authority();
    Config config(
        false,
        samplers::Config("const",
                         1,
                         samplingServerURLStream.str(),
                         0,
                         samplers::Config::Clock::duration()),
        reporters::Config(0,
                          reporters::Config::Clock::duration(),
                          false,
                          handle->_mockAgent->spanServerAddress().authority()),
        propagation::HeadersConfig(),
        baggage::RestrictionsConfig());

    auto tracer = Tracer::make("test-service", config, logging::nullLogger());
    opentracing::Tracer::InitGlobal(tracer);
    return std::move(handle);
}